

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcBmci.c
# Opt level: O1

int Bmc_BmciPart_rec(Gia_Man_t *pNew,Vec_Int_t *vSatMap,int iIdNew,Gia_Man_t *pPart,
                    Vec_Int_t *vPartMap,Vec_Int_t *vCopies)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  Gia_Obj_t *pFanout;
  uint uVar4;
  ulong uVar5;
  uint uVar6;
  ulong uVar7;
  Gia_Obj_t *pGVar8;
  int iVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  
  if ((iIdNew < 0) || (pNew->nObjs <= iIdNew)) {
    __assert_fail("v >= 0 && v < p->nObjs",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                  ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
  }
  if (vCopies->nSize <= iIdNew) {
LAB_00568b03:
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                  ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
  }
  if (vCopies->pArray[(uint)iIdNew] != 0) {
    return vCopies->pArray[(uint)iIdNew];
  }
  if (vSatMap->nSize <= iIdNew) goto LAB_00568b03;
  if (vSatMap->pArray[(uint)iIdNew] < 0) {
    pGVar8 = pNew->pObjs + (uint)iIdNew;
    uVar3 = (uint)*(ulong *)pGVar8;
    if ((uVar3 & 0x9fffffff) != 0x9fffffff) {
      if (((int)uVar3 < 0) || ((uVar3 & 0x1fffffff) == 0x1fffffff)) {
        __assert_fail("Gia_ObjIsAnd(pObj)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcBmci.c"
                      ,0x83,
                      "int Bmc_BmciPart_rec(Gia_Man_t *, Vec_Int_t *, int, Gia_Man_t *, Vec_Int_t *, Vec_Int_t *)"
                     );
      }
      uVar2 = Bmc_BmciPart_rec(pNew,vSatMap,iIdNew - (uVar3 & 0x1fffffff),pPart,vPartMap,vCopies);
      uVar3 = Bmc_BmciPart_rec(pNew,vSatMap,iIdNew - (*(uint *)&pGVar8->field_0x4 & 0x1fffffff),
                               pPart,vPartMap,vCopies);
      if (((int)uVar2 < 0) || ((int)uVar3 < 0)) {
        __assert_fail("Lit >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                      ,0x132,"int Abc_LitNotCond(int, int)");
      }
      uVar5 = *(ulong *)pGVar8;
      Vec_IntPush(vPartMap,iIdNew);
      pFanout = Gia_ManAppendObj(pPart);
      uVar6 = uVar2 >> 1;
      iVar1 = pPart->nObjs;
      if (iVar1 <= (int)uVar6) {
        __assert_fail("iLit0 >= 0 && Abc_Lit2Var(iLit0) < Gia_ManObjNum(p)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                      ,0x2a8,"int Gia_ManAppendAnd(Gia_Man_t *, int, int)");
      }
      uVar4 = uVar3 >> 1;
      if (iVar1 <= (int)uVar4) {
        __assert_fail("iLit1 >= 0 && Abc_Lit2Var(iLit1) < Gia_ManObjNum(p)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                      ,0x2a9,"int Gia_ManAppendAnd(Gia_Man_t *, int, int)");
      }
      if ((uVar6 == uVar4) && (pPart->fGiaSimple == 0)) {
        __assert_fail("p->fGiaSimple || Abc_Lit2Var(iLit0) != Abc_Lit2Var(iLit1)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                      ,0x2aa,"int Gia_ManAppendAnd(Gia_Man_t *, int, int)");
      }
      uVar2 = (uint)(uVar5 >> 0x1d) & 1 ^ uVar2;
      uVar3 = (uint)(uVar5 >> 0x3d) & 1 ^ uVar3;
      pGVar8 = pPart->pObjs;
      iVar9 = (int)pFanout;
      if ((int)uVar2 < (int)uVar3) {
        if (pGVar8 + iVar1 <= pFanout || pFanout < pGVar8) goto LAB_00568ae4;
        uVar5 = *(ulong *)pFanout;
        uVar10 = (ulong)((uVar2 & 1) << 0x1d |
                        ((uint)(iVar9 - (int)pGVar8) >> 2) * -0x55555555 - uVar6 & 0x1fffffff);
        *(ulong *)pFanout = uVar10 | uVar5 & 0xffffffffc0000000;
        pGVar8 = pPart->pObjs;
        if ((pFanout < pGVar8) || (pGVar8 + pPart->nObjs <= pFanout)) goto LAB_00568ae4;
        uVar7 = (ulong)(((uint)(iVar9 - (int)pGVar8) >> 2) * -0x55555555 - uVar4 & 0x1fffffff) <<
                0x20;
        *(ulong *)pFanout = uVar10 | uVar5 & 0xe0000000c0000000 | uVar7;
        uVar12 = (ulong)(uVar3 & 1) << 0x3d;
        uVar7 = uVar10 | uVar5 & 0xc0000000c0000000 | uVar7;
      }
      else {
        if (pGVar8 + iVar1 <= pFanout || pFanout < pGVar8) goto LAB_00568ae4;
        uVar5 = *(ulong *)pFanout;
        uVar11 = (ulong)(((uint)(iVar9 - (int)pGVar8) >> 2) * -0x55555555 - uVar6 & 0x1fffffff) <<
                 0x20;
        uVar10 = (ulong)(uVar2 & 1) << 0x3d;
        *(ulong *)pFanout = uVar10 | uVar5 & 0xc0000000ffffffff | uVar11;
        pGVar8 = pPart->pObjs;
        if ((pFanout < pGVar8) || (pGVar8 + pPart->nObjs <= pFanout)) goto LAB_00568ae4;
        uVar7 = (ulong)(((uint)(iVar9 - (int)pGVar8) >> 2) * -0x55555555 - uVar4 & 0x1fffffff);
        *(ulong *)pFanout = uVar10 | uVar5 & 0xc0000000e0000000 | uVar11 | uVar7;
        uVar12 = (ulong)((uVar3 & 1) << 0x1d);
        uVar7 = uVar10 | uVar5 & 0xc0000000c0000000 | uVar11 | uVar7;
      }
      *(ulong *)pFanout = uVar7 | uVar12;
      if (pPart->pFanData != (int *)0x0) {
        Gia_ObjAddFanout(pPart,pFanout + -(uVar7 & 0x1fffffff),pFanout);
        Gia_ObjAddFanout(pPart,pFanout + -((ulong)*(uint *)&pFanout->field_0x4 & 0x1fffffff),pFanout
                        );
      }
      if (pPart->fSweeper != 0) {
        uVar10 = *(ulong *)pFanout & 0x1fffffff;
        uVar5 = *(ulong *)pFanout >> 0x20 & 0x1fffffff;
        uVar11 = 0x4000000000000000;
        uVar7 = 0x4000000000000000;
        if (((uint)*(ulong *)(pFanout + -uVar10) >> 0x1e & 1) == 0) {
          uVar7 = 0x40000000;
        }
        *(ulong *)(pFanout + -uVar10) = uVar7 | *(ulong *)(pFanout + -uVar10);
        uVar7 = *(ulong *)(pFanout + -uVar5);
        if (((uint)uVar7 >> 0x1e & 1) == 0) {
          uVar11 = 0x40000000;
        }
        *(ulong *)(pFanout + -uVar5) = uVar11 | uVar7;
        uVar5 = *(ulong *)pFanout;
        *(ulong *)pFanout =
             uVar5 & 0x7fffffffffffffff |
             (ulong)(((uint)(uVar5 >> 0x3d) ^ (uint)(uVar7 >> 0x3f)) &
                    ((uint)((ulong)*(undefined8 *)(pFanout + -uVar10) >> 0x3f) ^
                    (uint)(uVar5 >> 0x1d) & 7)) << 0x3f;
      }
      if (pPart->fBuiltInSim != 0) {
        uVar5 = *(ulong *)pFanout;
        *(ulong *)pFanout =
             uVar5 & 0x7fffffffffffffff |
             (ulong)(((uint)(uVar5 >> 0x3d) ^
                     (uint)((ulong)*(undefined8 *)(pFanout + -(uVar5 >> 0x20 & 0x1fffffff)) >> 0x3f)
                     ) & ((uint)((ulong)*(undefined8 *)(pFanout + -(uVar5 & 0x1fffffff)) >> 0x3f) ^
                         (uint)(uVar5 >> 0x1d) & 7)) << 0x3f;
        pGVar8 = pPart->pObjs;
        if ((pFanout < pGVar8) || (pGVar8 + pPart->nObjs <= pFanout)) goto LAB_00568ae4;
        Gia_ManBuiltInSimPerform
                  (pPart,(int)((ulong)((long)pFanout - (long)pGVar8) >> 2) * -0x55555555);
      }
      if (pPart->vSuppWords != (Vec_Wrd_t *)0x0) {
        Gia_ManQuantSetSuppAnd(pPart,pFanout);
      }
      pGVar8 = pPart->pObjs;
      if ((pFanout < pGVar8) || (pGVar8 + pPart->nObjs <= pFanout)) goto LAB_00568ae4;
      iVar1 = vCopies->nSize;
      goto joined_r0x00568aa0;
    }
  }
  Vec_IntPush(vPartMap,iIdNew);
  pFanout = Gia_ManAppendObj(pPart);
  uVar5 = *(ulong *)pFanout;
  *(ulong *)pFanout = uVar5 | 0x9fffffff;
  *(ulong *)pFanout =
       uVar5 & 0xe0000000ffffffff | 0x9fffffff | (ulong)(pPart->vCis->nSize & 0x1fffffff) << 0x20;
  pGVar8 = pPart->pObjs;
  if ((pGVar8 <= pFanout) && (pFanout < pGVar8 + pPart->nObjs)) {
    Vec_IntPush(pPart->vCis,(int)((ulong)((long)pFanout - (long)pGVar8) >> 2) * -0x55555555);
    pGVar8 = pPart->pObjs;
    if ((pGVar8 <= pFanout) && (pFanout < pGVar8 + pPart->nObjs)) {
      iVar1 = vCopies->nSize;
joined_r0x00568aa0:
      if (iIdNew < iVar1) {
        iVar1 = (int)((ulong)((long)pFanout - (long)pGVar8) >> 2) * 0x55555556;
        vCopies->pArray[(uint)iIdNew] = iVar1;
        return iVar1;
      }
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                    ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
    }
  }
LAB_00568ae4:
  __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
}

Assistant:

int Bmc_BmciPart_rec( Gia_Man_t * pNew, Vec_Int_t * vSatMap, int iIdNew, Gia_Man_t * pPart, Vec_Int_t * vPartMap, Vec_Int_t * vCopies )
{
    Gia_Obj_t * pObj = Gia_ManObj( pNew, iIdNew ); 
    int iLitPart0, iLitPart1, iRes;
    if ( Vec_IntEntry(vCopies, iIdNew) )
        return Vec_IntEntry(vCopies, iIdNew);
    if ( Vec_IntEntry(vSatMap, iIdNew) >= 0 || Gia_ObjIsCi(pObj) )
    {
        Vec_IntPush( vPartMap, iIdNew );
        iRes = Gia_ManAppendCi(pPart);
        Vec_IntWriteEntry( vCopies, iIdNew, iRes );
        return iRes;
    }
    assert( Gia_ObjIsAnd(pObj) );
    iLitPart0 = Bmc_BmciPart_rec( pNew, vSatMap, Gia_ObjFaninId0(pObj, iIdNew), pPart, vPartMap, vCopies );
    iLitPart1 = Bmc_BmciPart_rec( pNew, vSatMap, Gia_ObjFaninId1(pObj, iIdNew), pPart, vPartMap, vCopies );
    iLitPart0 = Abc_LitNotCond( iLitPart0, Gia_ObjFaninC0(pObj) );
    iLitPart1 = Abc_LitNotCond( iLitPart1, Gia_ObjFaninC1(pObj) );
    Vec_IntPush( vPartMap, iIdNew );
    iRes = Gia_ManAppendAnd( pPart, iLitPart0, iLitPart1 );
    Vec_IntWriteEntry( vCopies, iIdNew, iRes );
    return iRes;
}